

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestCoverageHandler.cxx
# Opt level: O2

int __thiscall
cmCTestCoverageHandler::RunBullseyeCoverageBranch
          (cmCTestCoverageHandler *this,cmCTestCoverageHandlerContainer *cont,
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *coveredFileNames,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *files,vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *filesFullPath)

{
  cmCTest *pcVar1;
  _Base_ptr p_Var2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  ostream *poVar6;
  mapped_type *pmVar7;
  iterator iVar8;
  uint logFileCount;
  pointer __k;
  undefined **content;
  int local_728;
  int line;
  ulong local_720;
  char *local_718 [4];
  _Base_ptr local_6f8;
  _Base_ptr local_6f0;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_6e8;
  string file;
  string outputFile;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  fileMap;
  string lineIn;
  cmXMLWriter covLogXML;
  ostringstream cmCTestLog_msg_4;
  undefined4 uStack_5f4;
  ifstream fin;
  byte abStack_460 [488];
  cmGeneratedFileStream covLogFile;
  
  if ((long)(files->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_finish -
      (long)(files->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start ==
      (long)(filesFullPath->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_finish -
      (long)(filesFullPath->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start) {
    cmGeneratedFileStream::cmGeneratedFileStream(&covLogFile,None);
    cmXMLWriter::cmXMLWriter(&covLogXML,(ostream *)&covLogFile,0);
    bVar3 = StartCoverageLogFile(this,&covLogFile,0);
    if (bVar3) {
      StartCoverageLogXML(this,&covLogXML);
      outputFile._M_dataplus._M_p = (pointer)&outputFile.field_2;
      outputFile._M_string_length = 0;
      outputFile.field_2._M_local_buf[0] = '\0';
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&fin);
      poVar6 = std::operator<<((ostream *)&fin,"run covbr: ");
      std::endl<char,std::char_traits<char>>(poVar6);
      pcVar1 = (this->super_cmCTestGenericHandler).CTest;
      std::__cxx11::stringbuf::str();
      cmCTest::Log(pcVar1,5,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CTest/cmCTestCoverageHandler.cxx"
                   ,0x71e,(char *)CONCAT44(uStack_5f4,_cmCTestLog_msg_4),
                   (this->super_cmCTestGenericHandler).Quiet);
      std::__cxx11::string::~string((string *)&cmCTestLog_msg_4);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&fin);
      iVar5 = RunBullseyeCommand(this,cont,"covbr",(char *)0x0,&outputFile);
      if (iVar5 == 0) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&fin);
        poVar6 = std::operator<<((ostream *)&fin,"error running covbr for.");
        std::operator<<(poVar6,"\n");
        pcVar1 = (this->super_cmCTestGenericHandler).CTest;
        std::__cxx11::stringbuf::str();
        cmCTest::Log(pcVar1,7,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CTest/cmCTestCoverageHandler.cxx"
                     ,0x723,(char *)CONCAT44(uStack_5f4,_cmCTestLog_msg_4),false);
        std::__cxx11::string::~string((string *)&cmCTestLog_msg_4);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&fin);
        iVar5 = -1;
      }
      else {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&fin);
        poVar6 = std::operator<<((ostream *)&fin,"covbr output in  ");
        poVar6 = std::operator<<(poVar6,(string *)&outputFile);
        std::endl<char,std::char_traits<char>>(poVar6);
        pcVar1 = (this->super_cmCTestGenericHandler).CTest;
        std::__cxx11::stringbuf::str();
        cmCTest::Log(pcVar1,5,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CTest/cmCTestCoverageHandler.cxx"
                     ,0x728,(char *)CONCAT44(uStack_5f4,_cmCTestLog_msg_4),
                     (this->super_cmCTestGenericHandler).Quiet);
        std::__cxx11::string::~string((string *)&cmCTestLog_msg_4);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&fin);
        std::ifstream::ifstream(&fin,outputFile._M_dataplus._M_p,_S_in);
        if ((abStack_460[*(long *)(_fin + -0x18)] & 5) == 0) {
          fileMap._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
               &fileMap._M_t._M_impl.super__Rb_tree_header._M_header;
          fileMap._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
          fileMap._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
          fileMap._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
          fileMap._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
               fileMap._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          for (__k = (files->
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start;
              __k != (files->
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_finish; __k = __k + 1) {
            pmVar7 = std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ::operator[](&fileMap,__k);
            std::__cxx11::string::_M_assign((string *)pmVar7);
          }
          lineIn._M_dataplus._M_p = (pointer)&lineIn.field_2;
          lineIn._M_string_length = 0;
          line = 0;
          file._M_dataplus._M_p = (pointer)&file.field_2;
          file._M_string_length = 0;
          lineIn.field_2._M_local_buf[0] = '\0';
          local_720 = 0;
          file.field_2._M_local_buf[0] = '\0';
          local_6f0 = &(coveredFileNames->_M_t)._M_impl.super__Rb_tree_header._M_header;
          local_728 = 0;
          bVar3 = false;
          local_6e8 = &coveredFileNames->_M_t;
          while( true ) {
            bVar4 = cmsys::SystemTools::GetLineFromStream((istream *)&fin,&lineIn,(bool *)0x0,-1);
            if (!bVar4) break;
            if ((lineIn._M_string_length < 2) ||
               (lineIn._M_dataplus._M_p[lineIn._M_string_length - 1] != ':')) {
LAB_00164f4c:
              if (bVar3) {
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&cmCTestLog_msg_4,"Line",(allocator<char> *)local_718);
                cmXMLWriter::StartElement(&covLogXML,(string *)&cmCTestLog_msg_4);
                std::__cxx11::string::~string((string *)&cmCTestLog_msg_4);
                cmXMLWriter::Attribute<int>(&covLogXML,"Number",&line);
                _cmCTestLog_msg_4 = 0xffffffff;
                cmXMLWriter::Attribute<int>(&covLogXML,"Count",(int *)&cmCTestLog_msg_4);
                cmXMLWriter::Content<std::__cxx11::string>(&covLogXML,&lineIn);
                cmXMLWriter::EndElement(&covLogXML);
                line = line + 1;
              }
            }
            else {
              std::__cxx11::string::substr((ulong)&cmCTestLog_msg_4,(ulong)&lineIn);
              std::__cxx11::string::operator=((string *)&file,(string *)&cmCTestLog_msg_4);
              std::__cxx11::string::~string((string *)&cmCTestLog_msg_4);
              iVar8 = std::
                      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::find(local_6e8,&file);
              if (iVar8._M_node == local_6f0) goto LAB_00164f4c;
              if (bVar3) {
                cmXMLWriter::EndElement(&covLogXML);
                cmXMLWriter::EndElement(&covLogXML);
              }
              if (local_728 == 0) {
                local_728 = 0;
              }
              else if (local_728 % 100 == 0) {
                std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg_4);
                poVar6 = std::operator<<((ostream *)&cmCTestLog_msg_4,"start a new log file: ");
                poVar6 = (ostream *)std::ostream::operator<<(poVar6,local_728);
                std::endl<char,std::char_traits<char>>(poVar6);
                pcVar1 = (this->super_cmCTestGenericHandler).CTest;
                std::__cxx11::stringbuf::str();
                cmCTest::Log(pcVar1,5,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CTest/cmCTestCoverageHandler.cxx"
                             ,0x74f,local_718[0],(this->super_cmCTestGenericHandler).Quiet);
                std::__cxx11::string::~string((string *)local_718);
                std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg_4);
                EndCoverageLogXML(this,&covLogXML);
                EndCoverageLogFile(this,&covLogFile,(int)local_720);
                logFileCount = (int)local_720 + 1;
                local_720 = (ulong)logFileCount;
                bVar3 = StartCoverageLogFile(this,&covLogFile,logFileCount);
                if (!bVar3) {
                  iVar5 = -1;
                  goto LAB_001652e2;
                }
                StartCoverageLogXML(this,&covLogXML);
                local_728 = local_728 + 1;
              }
              local_6f8 = (_Base_ptr)
                          std::
                          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          ::find(&fileMap._M_t,&file);
              bVar3 = false;
              if ((_Rb_tree_header *)local_6f8 != &fileMap._M_t._M_impl.super__Rb_tree_header) {
                std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg_4);
                poVar6 = std::operator<<((ostream *)&cmCTestLog_msg_4,"Produce coverage for file: ")
                ;
                poVar6 = std::operator<<(poVar6,(string *)&file);
                poVar6 = std::operator<<(poVar6," ");
                local_728 = local_728 + 1;
                poVar6 = (ostream *)std::ostream::operator<<(poVar6,local_728);
                std::endl<char,std::char_traits<char>>(poVar6);
                pcVar1 = (this->super_cmCTestGenericHandler).CTest;
                std::__cxx11::stringbuf::str();
                cmCTest::Log(pcVar1,5,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CTest/cmCTestCoverageHandler.cxx"
                             ,0x761,local_718[0],(this->super_cmCTestGenericHandler).Quiet);
                std::__cxx11::string::~string((string *)local_718);
                std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg_4);
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&cmCTestLog_msg_4,"File",(allocator<char> *)local_718);
                cmXMLWriter::StartElement(&covLogXML,(string *)&cmCTestLog_msg_4);
                p_Var2 = local_6f8;
                std::__cxx11::string::~string((string *)&cmCTestLog_msg_4);
                cmXMLWriter::Attribute<std::__cxx11::string>
                          (&covLogXML,"Name",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           (p_Var2 + 1));
                cmCTest::GetShortPathToFile_abi_cxx11_
                          ((string *)&cmCTestLog_msg_4,(this->super_cmCTestGenericHandler).CTest,
                           *(char **)(p_Var2 + 2));
                cmXMLWriter::Attribute<std::__cxx11::string>
                          (&covLogXML,"FullPath",(string *)&cmCTestLog_msg_4);
                std::__cxx11::string::~string((string *)&cmCTestLog_msg_4);
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&cmCTestLog_msg_4,"Report",(allocator<char> *)local_718);
                cmXMLWriter::StartElement(&covLogXML,(string *)&cmCTestLog_msg_4);
                std::__cxx11::string::~string((string *)&cmCTestLog_msg_4);
                line = 0;
                for (content = &(anonymous_namespace)::bullseyeHelp; *content != (char *)0x0;
                    content = content + 1) {
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)&cmCTestLog_msg_4,"Line",(allocator<char> *)local_718);
                  cmXMLWriter::StartElement(&covLogXML,(string *)&cmCTestLog_msg_4);
                  std::__cxx11::string::~string((string *)&cmCTestLog_msg_4);
                  cmXMLWriter::Attribute<int>(&covLogXML,"Number",&line);
                  _cmCTestLog_msg_4 = 0xffffffff;
                  cmXMLWriter::Attribute<int>(&covLogXML,"Count",(int *)&cmCTestLog_msg_4);
                  cmXMLWriter::Content<char_const*>(&covLogXML,content);
                  cmXMLWriter::EndElement(&covLogXML);
                  line = line + 1;
                }
                bVar3 = true;
              }
            }
          }
          if (bVar3) {
            cmXMLWriter::EndElement(&covLogXML);
            cmXMLWriter::EndElement(&covLogXML);
          }
          EndCoverageLogXML(this,&covLogXML);
          EndCoverageLogFile(this,&covLogFile,(int)local_720);
          iVar5 = 1;
LAB_001652e2:
          std::__cxx11::string::~string((string *)&file);
          std::__cxx11::string::~string((string *)&lineIn);
          std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::~_Rb_tree(&fileMap._M_t);
        }
        else {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg_4);
          poVar6 = std::operator<<((ostream *)&cmCTestLog_msg_4,"Cannot open coverage file: ");
          poVar6 = std::operator<<(poVar6,(string *)&outputFile);
          std::endl<char,std::char_traits<char>>(poVar6);
          pcVar1 = (this->super_cmCTestGenericHandler).CTest;
          std::__cxx11::stringbuf::str();
          iVar5 = 0;
          cmCTest::Log(pcVar1,7,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CTest/cmCTestCoverageHandler.cxx"
                       ,0x72d,(char *)fileMap._M_t._M_impl._0_8_,false);
          std::__cxx11::string::~string((string *)&fileMap);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg_4);
        }
        std::ifstream::~ifstream(&fin);
      }
      std::__cxx11::string::~string((string *)&outputFile);
    }
    else {
      iVar5 = -1;
    }
    cmXMLWriter::~cmXMLWriter(&covLogXML);
    cmGeneratedFileStream::~cmGeneratedFileStream(&covLogFile);
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&covLogFile);
    std::operator<<((ostream *)&covLogFile,"Files and full path files not the same size?:\n");
    pcVar1 = (this->super_cmCTestGenericHandler).CTest;
    std::__cxx11::stringbuf::str();
    iVar5 = 0;
    cmCTest::Log(pcVar1,7,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CTest/cmCTestCoverageHandler.cxx"
                 ,0x70f,_fin,false);
    std::__cxx11::string::~string((string *)&fin);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&covLogFile);
  }
  return iVar5;
}

Assistant:

int cmCTestCoverageHandler::RunBullseyeCoverageBranch(
  cmCTestCoverageHandlerContainer* cont,
  std::set<std::string>& coveredFileNames, std::vector<std::string>& files,
  std::vector<std::string>& filesFullPath)
{
  if (files.size() != filesFullPath.size()) {
    cmCTestLog(this->CTest, ERROR_MESSAGE,
               "Files and full path files not the same size?:\n");
    return 0;
  }
  // create the output stream for the CoverageLog-N.xml file
  cmGeneratedFileStream covLogFile;
  cmXMLWriter covLogXML(covLogFile);
  int logFileCount = 0;
  if (!this->StartCoverageLogFile(covLogFile, logFileCount)) {
    return -1;
  }
  this->StartCoverageLogXML(covLogXML);
  // for each file run covbr on that file to get the coverage
  // information for that file
  std::string outputFile;
  cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                     "run covbr: " << std::endl, this->Quiet);

  if (!this->RunBullseyeCommand(cont, "covbr", nullptr, outputFile)) {
    cmCTestLog(this->CTest, ERROR_MESSAGE,
               "error running covbr for."
                 << "\n");
    return -1;
  }
  cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                     "covbr output in  " << outputFile << std::endl,
                     this->Quiet);
  // open the output file
  cmsys::ifstream fin(outputFile.c_str());
  if (!fin) {
    cmCTestLog(this->CTest, ERROR_MESSAGE,
               "Cannot open coverage file: " << outputFile << std::endl);
    return 0;
  }
  std::map<std::string, std::string> fileMap;
  std::vector<std::string>::iterator fp = filesFullPath.begin();
  for (std::vector<std::string>::iterator f = files.begin(); f != files.end();
       ++f, ++fp) {
    fileMap[*f] = *fp;
  }

  int count = 0; // keep count of the number of files
  // Now parse each line from the bullseye cov log file
  std::string lineIn;
  bool valid = false; // are we in a valid output file
  int line = 0;       // line of the current file
  std::string file;
  while (cmSystemTools::GetLineFromStream(fin, lineIn)) {
    bool startFile = false;
    if (lineIn.size() > 1 && lineIn[lineIn.size() - 1] == ':') {
      file = lineIn.substr(0, lineIn.size() - 1);
      if (coveredFileNames.find(file) != coveredFileNames.end()) {
        startFile = true;
      }
    }
    if (startFile) {
      // if we are in a valid file close it because a new one started
      if (valid) {
        covLogXML.EndElement(); // Report
        covLogXML.EndElement(); // File
      }
      // only allow 100 files in each log file
      if (count != 0 && count % 100 == 0) {
        cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                           "start a new log file: " << count << std::endl,
                           this->Quiet);
        this->EndCoverageLogXML(covLogXML);
        this->EndCoverageLogFile(covLogFile, logFileCount);
        logFileCount++;
        if (!this->StartCoverageLogFile(covLogFile, logFileCount)) {
          return -1;
        }
        this->StartCoverageLogXML(covLogXML);
        count++; // move on one
      }
      std::map<std::string, std::string>::iterator i = fileMap.find(file);
      // if the file should be covered write out the header for that file
      if (i != fileMap.end()) {
        // we have a new file so count it in the output
        count++;
        cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                           "Produce coverage for file: " << file << " "
                                                         << count << std::endl,
                           this->Quiet);
        // start the file output
        covLogXML.StartElement("File");
        covLogXML.Attribute("Name", i->first);
        covLogXML.Attribute(
          "FullPath", this->CTest->GetShortPathToFile(i->second.c_str()));
        covLogXML.StartElement("Report");
        // write the bullseye header
        line = 0;
        for (int k = 0; bullseyeHelp[k] != nullptr; ++k) {
          covLogXML.StartElement("Line");
          covLogXML.Attribute("Number", line);
          covLogXML.Attribute("Count", -1);
          covLogXML.Content(bullseyeHelp[k]);
          covLogXML.EndElement(); // Line
          line++;
        }
        valid = true; // we are in a valid file section
      } else {
        // this is not a file that we want coverage for
        valid = false;
      }
    }
    // we are not at a start file, and we are in a valid file output the line
    else if (valid) {
      covLogXML.StartElement("Line");
      covLogXML.Attribute("Number", line);
      covLogXML.Attribute("Count", -1);
      covLogXML.Content(lineIn);
      covLogXML.EndElement(); // Line
      line++;
    }
  }
  // if we ran out of lines a valid file then close that file
  if (valid) {
    covLogXML.EndElement(); // Report
    covLogXML.EndElement(); // File
  }
  this->EndCoverageLogXML(covLogXML);
  this->EndCoverageLogFile(covLogFile, logFileCount);
  return 1;
}